

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

int lnsrchmod(custom_function *funcpt,custom_gradient *funcgrad,double *xi,double *jac,double *p,
             int N,double *dx,double maxstep,double eps2,double stol,double *x,double *jacf)

{
  int iVar1;
  double *C;
  double *C_00;
  double *A;
  double *B;
  double *C_01;
  double *array;
  double *B_00;
  ulong uVar2;
  double *pdVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double local_138;
  undefined8 local_f8;
  double local_e8;
  double local_c0;
  double local_60;
  double local_58;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_01 = (double *)malloc(0x10);
  array = (double *)malloc((long)N * 8);
  B_00 = (double *)malloc((long)N * 8);
  uVar2 = 0;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  local_c0 = 0.0;
  for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    local_c0 = local_c0 + dx[uVar2] * p[uVar2] * dx[uVar2] * p[uVar2];
  }
  if (local_c0 < 0.0) {
    local_c0 = sqrt(local_c0);
  }
  else {
    local_c0 = SQRT(local_c0);
  }
  if (maxstep < local_c0) {
    scale(p,1,N,maxstep / local_c0);
    local_c0 = maxstep;
  }
  mmult(jac,p,C,1,N,1);
  for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    dVar7 = ABS(xi[uVar2]);
    if (ABS(xi[uVar2]) <= 1.0 / ABS(dx[uVar2])) {
      dVar7 = 1.0 / ABS(dx[uVar2]);
    }
    array[uVar2] = p[uVar2] / dVar7;
  }
  dVar7 = array_max_abs(array,N);
  dVar8 = (*funcpt->funcpt)(xi,N,funcpt->params);
  iVar1 = 0xf;
  if (1.79769313486232e+308 <= ABS(dVar8)) {
    pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
  }
  else {
    if (!NAN(dVar8)) {
      dVar9 = maxstep / local_c0;
      local_e8 = 1.0;
      local_f8 = 1.0;
      dVar11 = 1.0;
      iVar4 = 100;
LAB_001222fc:
      do {
        dVar12 = dVar11;
        do {
          while( true ) {
            if (iVar4 < 2) {
              iVar1 = 5;
              if (iVar4 != -5) {
                iVar1 = iVar4;
              }
              goto LAB_00122c1a;
            }
            for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
              B_00[uVar2] = p[uVar2] * dVar12;
            }
            madd(xi,B_00,x,1,N);
            dVar10 = (*funcpt->funcpt)(x,N,funcpt->params);
            if (1.79769313486232e+308 <= ABS(dVar10)) goto LAB_00122be9;
            if (NAN(dVar10)) goto LAB_00122bf2;
            dVar11 = *C;
            if (dVar10 <= dVar12 * 0.0001 * dVar11 + dVar8) break;
            if (stol / dVar7 <= dVar12) {
              if ((dVar12 != 1.0) || (NAN(dVar12))) {
                *A = 1.0 / (dVar12 * dVar12);
                A[1] = -1.0 / (local_f8 * local_f8);
                A[2] = -local_f8 / (dVar12 * dVar12);
                A[3] = dVar12 / (local_f8 * local_f8);
                *B = (dVar10 - dVar8) - dVar12 * dVar11;
                B[1] = (local_e8 - dVar8) - local_f8 * dVar11;
                mmult(A,B,C_01,2,2,1);
                scale(C_01,1,2,1.0 / (dVar12 - local_f8));
                dVar11 = *C_01;
                if ((dVar11 != 0.0) || (NAN(dVar11))) {
                  dVar15 = C_01[1];
                  dVar11 = dVar15 * dVar15 + dVar11 * -3.0 * *C;
                  if (dVar11 < 0.0) {
                    dVar11 = sqrt(dVar11);
                  }
                  else {
                    dVar11 = SQRT(dVar11);
                  }
                  dVar11 = dVar11 - dVar15;
                  uVar13 = 0x40080000;
                  pdVar3 = C_01;
                }
                else {
                  dVar11 = -*C;
                  uVar13 = 0x40000000;
                  pdVar3 = C_01 + 1;
                }
                dVar11 = dVar11 / ((double)((ulong)uVar13 << 0x20) * *pdVar3);
                if (dVar12 * 0.5 < dVar11) {
                  dVar11 = dVar12 * 0.5;
                }
              }
              else {
                dVar15 = (dVar10 - dVar8) - dVar11;
                dVar11 = -dVar11 / (dVar15 + dVar15);
              }
              uVar2 = -(ulong)(dVar11 <= dVar12 * 0.1);
              dVar11 = (double)(~uVar2 & (ulong)dVar11 | (ulong)(dVar12 * 0.1) & uVar2);
              local_f8 = dVar12;
              local_e8 = dVar10;
              goto LAB_001222fc;
            }
            for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
              x[uVar2] = xi[uVar2];
            }
            iVar4 = 1;
          }
          iVar1 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
          if (iVar1 == 0xf) {
            return 0xf;
          }
          mmult(jacf,p,C_00,1,N,1);
          dVar15 = *C;
          iVar4 = 0;
        } while (dVar15 * 0.4 < *C_00 || dVar15 * 0.4 == *C_00);
        if (((local_c0 < maxstep) && (dVar12 == 1.0)) && (!NAN(dVar12))) {
          dVar11 = dVar10;
          dVar12 = 1.0;
          while (((dVar10 = dVar11, dVar10 <= dVar12 * 0.0001 * dVar15 + dVar8 &&
                  (*C_00 <= dVar15 * 0.4 && dVar15 * 0.4 != *C_00)) && (dVar12 < dVar9))) {
            dVar14 = dVar12 + dVar12;
            if (dVar9 <= dVar12 + dVar12) {
              dVar14 = dVar9;
            }
            for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
              B_00[uVar2] = p[uVar2] * dVar14;
            }
            madd(xi,B_00,x,1,N);
            dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
            if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_00122be9;
            if (NAN(dVar11)) goto LAB_00122bf2;
            dVar15 = *C;
            local_f8._0_4_ = SUB84(dVar12,0);
            local_f8._4_4_ = (undefined4)((ulong)dVar12 >> 0x20);
            dVar12 = dVar14;
            local_e8 = dVar10;
            if (dVar11 <= dVar14 * 0.0001 * dVar15 + dVar8) {
              iVar1 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
              if (iVar1 == 0xf) goto LAB_00122c00;
              mmult(jacf,p,C_00,1,N,1);
              dVar15 = *C;
            }
          }
        }
        if (dVar12 < 1.0) break;
        dVar11 = dVar12;
        iVar4 = 0;
      } while ((dVar12 <= 1.0) || (iVar4 = 0, dVar10 <= dVar12 * 0.0001 * dVar15 + dVar8));
      local_60 = local_e8;
      local_58 = dVar12;
      if (local_f8 <= dVar12) {
        local_58 = local_f8;
        local_60 = dVar10;
      }
      local_138 = (double)(~-(ulong)(dVar12 < local_f8) & (ulong)local_e8 |
                          (ulong)dVar10 & -(ulong)(dVar12 < local_f8));
      dVar11 = ABS(local_f8 - dVar12);
      dVar10 = local_60;
LAB_001228bd:
      do {
        local_60 = dVar10;
        dVar14 = dVar11;
        do {
          dVar10 = *C_00;
          if ((dVar15 * 0.4 <= dVar10) || (dVar14 < stol / dVar7)) {
            dVar11 = dVar12;
            iVar4 = 0;
            if (dVar10 < dVar15 * 0.4) {
              for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
                B_00[uVar2] = p[uVar2] * local_58;
              }
              madd(xi,B_00,x,1,N);
              iVar4 = -5;
            }
            goto LAB_001222fc;
          }
          dVar11 = local_60 - (dVar10 * dVar14 + local_138);
          dVar12 = (-dVar10 * dVar14 * dVar14) / (dVar11 + dVar11);
          dVar11 = dVar14 * 0.2;
          if (dVar14 * 0.2 <= dVar12) {
            dVar11 = dVar12;
          }
          dVar12 = local_58 + dVar11;
          for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
            B_00[uVar2] = p[uVar2] * dVar12;
          }
          madd(xi,B_00,x,1,N);
          dVar10 = (*funcpt->funcpt)(x,N,funcpt->params);
          if (1.79769313486232e+308 <= ABS(dVar10)) goto LAB_00122be9;
          if (NAN(dVar10)) goto LAB_00122bf2;
          dVar15 = *C;
          if (dVar12 * 0.0001 * dVar15 + dVar8 < dVar10) goto LAB_001228bd;
          iVar1 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
          if (iVar1 == 0xf) goto LAB_00122c00;
          mmult(jacf,p,C_00,1,N,1);
          dVar15 = *C;
        } while (dVar15 * 0.4 < *C_00 || dVar15 * 0.4 == *C_00);
        dVar11 = dVar14 - dVar11;
        local_138 = dVar10;
        local_58 = dVar12;
        dVar10 = local_60;
      } while( true );
    }
    pcVar5 = "Program Exiting as the function returns NaN";
  }
  printf(pcVar5);
LAB_00122c1a:
  free(C);
  goto LAB_00122c23;
LAB_00122be9:
  pcVar5 = "Program Exiting as the function value exceeds the maximum double value";
  goto LAB_00122bf9;
LAB_00122bf2:
  pcVar5 = "Program Exiting as the function returns NaN";
LAB_00122bf9:
  printf(pcVar5);
LAB_00122c00:
  free(C);
  iVar1 = 0xf;
LAB_00122c23:
  free(A);
  free(B);
  free(C_01);
  free(array);
  free(B_00);
  free(C_00);
  return iVar1;
}

Assistant:

int lnsrchmod(custom_function *funcpt, custom_gradient *funcgrad, double *xi, double *jac, double *p, int N, double * dx, double maxstep,
		double eps2,double stol,double *x,double *jacf) {
	int retval,i,gfdcode;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	double *slopen;
	double beta,lambdamax,lambdalo,lambdainc,lambdadiff,funclo,funchi;
	
	slopei = (double*) malloc(sizeof(double) *1);
	slopen = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	beta = 0.4;
	gfdcode = 0;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	//mdisplay(p,1,N);
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	while (retval > 1) {
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		//printf("%g lmax %g %g \n",lambda,funcf,funci + alpha *lambda *slopei[0]);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
			if (gfdcode == 15) {
				return 15;
			}
			mmult(jacf,p,slopen,1,N,1);
			
			if(slopen[0] < beta * slopei[0]) {
					if (lambda == 1.0 && nlen < maxstep) {
						lambdamax = maxstep / nlen;
						
						while (funcf <= funci + alpha *lambda *slopei[0] && slopen[0] < beta * slopei[0] && lambda < lambdamax) {
							lambdaprev = lambda;
							funcprev = funcf;
							if ( 2*lambda < lambdamax) {
								lambda = 2*lambda;
							} else {
								lambda = lambdamax;
							}
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf <= funci + alpha *lambda *slopei[0]) {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
							}
						}
						
					}
					if (lambda < 1.0 || (lambda > 1.0 && funcf > funci + alpha *lambda *slopei[0])) {
						
						if (lambda < lambdaprev) {
							lambdalo = lambda; 
						} else {
							lambdalo = lambdaprev; 
						}
						lambdadiff = fabs(lambdaprev - lambda);
						
						if (lambda < lambdaprev) {
							funclo = funcf;
							funchi = funcprev;
						} else {
							funchi = funcf;
							funclo = funcprev;
						}

						while ((slopen[0] < beta * slopei[0]) && lambdadiff >= lambdamin) {
							lambdainc = -slopen[0] * lambdadiff * lambdadiff / (2.0 * (funchi - (funclo + slopen[0] *lambdadiff)));
							if ( lambdainc < 0.2 * lambdadiff) {
								lambdainc = 0.2 * lambdadiff;
							}
							lambda = lambdalo + lambdainc;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf > funci + alpha *lambda *slopei[0]) {
								lambdadiff = lambdainc;
								funchi = funcf;
							} else {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
								if (slopen[0] < beta * slopei[0]) {
									lambdalo = lambda;
									lambdadiff -= lambdainc;
									funclo = funcf;
								}
							}
						}
						if (slopen[0] < beta * slopei[0]) {
							retval = -5;
							funcf = funclo;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambdalo;
							}
							madd(xi,pl,x,1,N);
						}
					}
						
			}
			
			if (retval != -5) {
				retval = 0;
			}
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	if (retval == -5) {
		retval = 5;
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	free(slopen);
	return retval;
}